

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<unsigned_int> * __thiscall
VW::config::typed_option<unsigned_int>::value(typed_option<unsigned_int> *this,uint value)

{
  __shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<unsigned_int,unsigned_int&>((uint *)&local_20);
  std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_value).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>,&local_20
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }